

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::optimizeTernary<wasm::If>(OptimizeInstructions *this,If *curr)

{
  uintptr_t uVar1;
  Expression *pEVar2;
  uintptr_t uVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  Expression **ppEVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  bool bVar10;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Const **local_138;
  anon_class_16_2_7fa2728d check;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_110;
  undefined1 local_f8 [8];
  anon_class_24_3_af057605 updateArm;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_d0;
  Const *local_b8;
  Unary *un;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_90;
  OptimizeInstructions *local_78;
  Unary *local_70;
  Const *c;
  pointer local_60;
  pointer ppEStack_58;
  pointer local_50;
  undefined1 local_48 [8];
  Type newType;
  Expression *local_38;
  Expression *reuse;
  
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id == 1) ||
      ((curr->ifTrue->type).id == 1)) || ((curr->ifFalse->type).id == 1)) {
LAB_00ad94e9:
    local_70 = (Unary *)0x0;
    local_60 = (pointer)0x0;
    ppEStack_58 = (pointer)0x0;
    local_50 = (pointer)0x0;
    local_78 = this;
    do {
      uVar6 = (ulong)curr->ifTrue->_id;
      if ((uVar6 < 0x36) && ((0x3000000000000eU >> (uVar6 & 0x3f) & 1) != 0)) break;
      bVar5 = ExpressionAnalyzer::shallowEqual(curr->ifTrue,curr->ifFalse);
      if (!bVar5) break;
      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)local_f8,curr->ifTrue);
      if (((long)local_d0._M_impl.super__Vector_impl_data._M_finish -
           (long)local_d0._M_impl.super__Vector_impl_data._M_start >> 3) + (long)local_f8 == 1) {
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)&stack0xfffffffffffffec8,
                   curr->ifFalse);
        un._0_4_ = 0;
        local_b8 = (Const *)local_f8;
        ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                            ((Iterator *)&stack0xffffffffffffff48);
        pEVar8 = *ppEVar7;
        un._0_4_ = 0;
        local_b8 = (Const *)&stack0xfffffffffffffec8;
        ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                            ((Iterator *)&stack0xffffffffffffff48);
        pEVar9 = curr->ifFalse;
        uVar1 = (curr->ifTrue->type).id;
        if (uVar1 != (pEVar9->type).id) {
          __assert_fail("curr->ifTrue->type == curr->ifFalse->type",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0x15cb,
                        "void wasm::OptimizeInstructions::optimizeTernary(T *) [T = wasm::If]");
        }
        pEVar2 = *ppEVar7;
        uVar3 = (pEVar2->type).id;
        bVar10 = (pEVar8->type).id == uVar3;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload._1_7_ = (undefined7)(uVar3 >> 8);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ = bVar10;
        bVar5 = ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id
                != 1) == (uVar1 == 1);
        bVar4 = false;
        if (!bVar5 && bVar10) {
          curr->ifTrue = pEVar8;
          curr->ifFalse = pEVar2;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          local_38 = pEVar9;
          If::finalize(curr,type_);
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                    ((AbstractChildIterator<wasm::ChildIterator> *)&stack0xffffffffffffff48,local_38
                    );
          newType.id._0_4_ = 0;
          local_48 = (undefined1  [8])&stack0xffffffffffffff48;
          ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                              ((Iterator *)local_48);
          *ppEVar7 = (Expression *)curr;
          std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
          ~_Vector_base(&local_90);
          pEVar8 = local_38;
          if (&(local_70->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id +
              ((long)ppEStack_58 - (long)local_60 >> 3) != (Id *)0x0) {
            ppEVar7 = SmallVector<wasm::Expression_*,_1UL>::back
                                ((SmallVector<wasm::Expression_*,_1UL> *)&stack0xffffffffffffff90);
            AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                      ((AbstractChildIterator<wasm::ChildIterator> *)&stack0xffffffffffffff48,
                       *ppEVar7);
            newType.id._0_4_ = 0;
            local_48 = (undefined1  [8])&stack0xffffffffffffff48;
            ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                                ((Iterator *)local_48);
            *ppEVar7 = pEVar8;
            std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
            ~_Vector_base(&local_90);
          }
          SmallVector<wasm::Expression_*,_1UL>::push_back
                    ((SmallVector<wasm::Expression_*,_1UL> *)&stack0xffffffffffffff90,&local_38);
          bVar4 = true;
        }
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  (&local_110);
        if (bVar5 || !bVar10) goto LAB_00ad96c3;
      }
      else {
LAB_00ad96c3:
        bVar4 = false;
      }
      std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                (&local_d0);
    } while (bVar4);
    if (&(local_70->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id +
        ((long)ppEStack_58 - (long)local_60 >> 3) != (Id *)0x0) {
      replaceCurrent(local_78,(Expression *)c);
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               &stack0xffffffffffffffa0);
  }
  else {
    local_138 = (Const **)&stack0xffffffffffffff90;
    check.c = &stack0xffffffffffffff48;
    bVar5 = optimizeTernary<wasm::If>::anon_class_16_2_7fa2728d::operator()
                      ((anon_class_16_2_7fa2728d *)&stack0xfffffffffffffec8,curr->ifTrue,
                       curr->ifFalse);
    if (!bVar5) {
      bVar5 = optimizeTernary<wasm::If>::anon_class_16_2_7fa2728d::operator()
                        ((anon_class_16_2_7fa2728d *)&stack0xfffffffffffffec8,curr->ifFalse,
                         curr->ifTrue);
      if (!bVar5) goto LAB_00ad94e9;
    }
    local_48 = *(undefined1 (*) [8])
                &((local_b8->value).field_0.gcData.
                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count;
    updateArm.c = (Const **)local_48;
    local_f8 = (undefined1  [8])&stack0xffffffffffffff48;
    updateArm.un = &stack0xffffffffffffff90;
    pEVar8 = optimizeTernary<wasm::If>::anon_class_24_3_af057605::operator()
                       ((anon_class_24_3_af057605 *)local_f8,curr->ifTrue);
    curr->ifTrue = pEVar8;
    pEVar8 = curr->ifFalse;
    pEVar9 = optimizeTernary<wasm::If>::anon_class_24_3_af057605::operator()
                       ((anon_class_24_3_af057605 *)local_f8,pEVar8);
    curr->ifFalse = pEVar9;
    (local_b8->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)curr;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar8;
    If::finalize(curr,type__00);
    replaceCurrent(this,(Expression *)local_b8);
  }
  return;
}

Assistant:

void optimizeTernary(T* curr) {
    using namespace Abstract;
    using namespace Match;
    Builder builder(*getModule());

    // If one arm is an operation and the other is an appropriate constant, we
    // can move the operation outside (where it may be further optimized), e.g.
    //
    //  (select
    //    (i32.eqz (X))
    //    (i32.const 0|1)
    //    (Y)
    //  )
    // =>
    //  (i32.eqz
    //    (select
    //      (X)
    //      (i32.const 1|0)
    //      (Y)
    //    )
    //  )
    //
    // Ignore unreachable code here; leave that for DCE.
    if (curr->type != Type::unreachable &&
        curr->ifTrue->type != Type::unreachable &&
        curr->ifFalse->type != Type::unreachable) {
      Unary* un;
      Const* c;
      auto check = [&](Expression* a, Expression* b) {
        return matches(b, bval(&c)) && matches(a, unary(&un, EqZ, any()));
      };
      if (check(curr->ifTrue, curr->ifFalse) ||
          check(curr->ifFalse, curr->ifTrue)) {
        // The new type of curr will be that of the value of the unary, as after
        // we move the unary out, its value is curr's direct child.
        auto newType = un->value->type;
        auto updateArm = [&](Expression* arm) -> Expression* {
          if (arm == un) {
            // This is the arm that had the eqz, which we need to remove.
            return un->value;
          } else {
            // This is the arm with the constant, which we need to flip.
            // Note that we also need to set the type to match the other arm.
            c->value =
              Literal::makeFromInt32(1 - c->value.getInteger(), newType);
            c->type = newType;
            return c;
          }
        };
        curr->ifTrue = updateArm(curr->ifTrue);
        curr->ifFalse = updateArm(curr->ifFalse);
        un->value = curr;
        curr->finalize();
        return replaceCurrent(un);
      }
    }

    {
      // Identical code on both arms can be folded out, e.g.
      //
      //  (select
      //    (i32.eqz (X))
      //    (i32.eqz (Y))
      //    (Z)
      //  )
      // =>
      //  (i32.eqz
      //    (select
      //      (X)
      //      (Y)
      //      (Z)
      //    )
      //  )
      //
      // Continue doing this while we can, noting the chain of moved expressions
      // as we go, then do a single replaceCurrent() at the end.
      SmallVector<Expression*, 1> chain;
      while (1) {
        // Ignore control flow structures (which are handled in MergeBlocks).
        if (!Properties::isControlFlowStructure(curr->ifTrue) &&
            ExpressionAnalyzer::shallowEqual(curr->ifTrue, curr->ifFalse)) {
          // TODO: consider the case with more than one child.
          ChildIterator ifTrueChildren(curr->ifTrue);
          if (ifTrueChildren.children.size() == 1) {
            // ifTrue and ifFalse's children will become the direct children of
            // curr, and so they must be compatible to allow for a proper new
            // type after the transformation.
            //
            // At minimum an LUB is required, as shown here:
            //
            //  (if
            //    (condition)
            //    (drop (i32.const 1))
            //    (drop (f64.const 2.0))
            //  )
            //
            // However, that may not be enough, as with nominal types we can
            // have things like this:
            //
            //  (if
            //    (condition)
            //    (struct.get $A 1 (..))
            //    (struct.get $B 1 (..))
            //  )
            //
            // It is possible that the LUB of $A and $B does not contain field
            // "1". With structural types this specific problem is not possible,
            // and it appears to be the case that with the GC MVP there is no
            // instruction that poses a problem, but in principle it can happen
            // there as well, if we add an instruction that returns the number
            // of fields in a type, for example. For that reason, and to avoid
            // a difference between structural and nominal typing here, disallow
            // subtyping in both. (Note: In that example, the problem only
            // happens because the type is not part of the struct.get - we infer
            // it from the reference. That is why after hoisting the struct.get
            // out, and computing a new type for the if that is now the child of
            // the single struct.get, we get a struct.get of a supertype. So in
            // principle we could fix this by modifying the IR as well, but the
            // problem is more general, so avoid that.)
            ChildIterator ifFalseChildren(curr->ifFalse);
            auto* ifTrueChild = *ifTrueChildren.begin();
            auto* ifFalseChild = *ifFalseChildren.begin();
            bool validTypes = ifTrueChild->type == ifFalseChild->type;

            // In addition, after we move code outside of curr then we need to
            // not change unreachability - if we did, we'd need to propagate
            // that further, and we leave such work to DCE and Vacuum anyhow.
            // This can happen in something like this for example, where the
            // outer type changes from i32 to unreachable if we move the
            // returns outside:
            //
            //  (if (result i32)
            //    (local.get $x)
            //    (return
            //      (local.get $y)
            //    )
            //    (return
            //      (local.get $z)
            //    )
            //  )
            assert(curr->ifTrue->type == curr->ifFalse->type);
            auto newOuterType = curr->ifTrue->type;
            if ((newOuterType == Type::unreachable) !=
                (curr->type == Type::unreachable)) {
              validTypes = false;
            }

            // If the expression we are about to move outside has side effects,
            // then we cannot do so in general with a select: we'd be reducing
            // the amount of the effects as well as moving them. For an if,
            // the side effects execute once, so there is no problem.
            // TODO: handle certain side effects when possible in select
            bool validEffects = std::is_same<T, If>::value ||
                                !ShallowEffectAnalyzer(
                                   getPassOptions(), *getModule(), curr->ifTrue)
                                   .hasSideEffects();

            // In addition, check for specific limitations of select.
            bool validChildren =
              !std::is_same<T, Select>::value ||
              Properties::canEmitSelectWithArms(ifTrueChild, ifFalseChild);

            if (validTypes && validEffects && validChildren) {
              // Replace ifTrue with its child.
              curr->ifTrue = ifTrueChild;
              // Relace ifFalse with its child, and reuse that node outside.
              auto* reuse = curr->ifFalse;
              curr->ifFalse = ifFalseChild;
              // curr's type may have changed, if the instructions we moved out
              // had different input types than output types.
              curr->finalize();
              // Point to curr from the code that is now outside of it.
              *ChildIterator(reuse).begin() = curr;
              if (!chain.empty()) {
                // We've already moved things out, so chain them to there. That
                // is, the end of the chain should now point to reuse (which
                // in turn already points to curr).
                *ChildIterator(chain.back()).begin() = reuse;
              }
              chain.push_back(reuse);
              continue;
            }
          }
        }
        break;
      }
      if (!chain.empty()) {
        // The beginning of the chain is the new top parent.
        return replaceCurrent(chain[0]);
      }
    }
  }